

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O1

void uv__async_stop(uv_loop_t *loop,uv__async *wa)

{
  if ((wa->io_watcher).fd != -1) {
    uv__io_stop(loop,&wa->io_watcher,1);
    uv__close((wa->io_watcher).fd);
    (wa->io_watcher).fd = -1;
    if (wa->wfd != -1) {
      uv__close(wa->wfd);
      wa->wfd = -1;
    }
  }
  return;
}

Assistant:

void uv__async_stop(uv_loop_t* loop, struct uv__async* wa) {
  if (wa->io_watcher.fd == -1)
    return;

  uv__io_stop(loop, &wa->io_watcher, UV__POLLIN);
  uv__close(wa->io_watcher.fd);
  wa->io_watcher.fd = -1;

  if (wa->wfd != -1) {
    uv__close(wa->wfd);
    wa->wfd = -1;
  }
}